

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall File::readBool(File *this,bool *value)

{
  size_t sVar1;
  byte *in_RSI;
  long in_RDI;
  uchar boolValue;
  char local_19;
  byte *local_18;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    local_1 = false;
  }
  else {
    local_18 = in_RSI;
    sVar1 = fread(&local_19,1,1,*(FILE **)(in_RDI + 0x30));
    if (sVar1 == 1) {
      *local_18 = -(local_19 != '\0') & 1;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool File::readBool(bool& value)
{
	if (!valid) return false;

	// Read the boolean from the file
	unsigned char boolValue;

	if (fread(&boolValue, 1, 1, stream) != 1)
	{
		return false;
	}

	value = boolValue ? true : false;

	return true;
}